

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall ktx::ValidationContext::validateHeader(ValidationContext *this)

{
  ktx_uint32_t *args_1;
  ktx_uint32_t *pkVar1;
  ktx_uint32_t *pkVar2;
  ktx_uint32_t *args;
  ktx_uint32_t *args_1_00;
  VkFormat format;
  ktx_uint32_t kVar3;
  ktx_uint32_t kVar4;
  char cVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  char *__s;
  size_t sVar9;
  uint32_t uVar10;
  uint uVar11;
  VkFormat format_00;
  VkFormat extraout_EDX;
  VkFormat extraout_EDX_00;
  VkFormat format_01;
  VkFormat extraout_EDX_01;
  VkFormat extraout_EDX_02;
  VkFormat extraout_EDX_03;
  VkFormat extraout_EDX_04;
  VkFormat extraout_EDX_05;
  VkFormat format_02;
  VkFormat extraout_EDX_06;
  VkFormat extraout_EDX_07;
  VkFormat format_03;
  VkFormat format_04;
  ktxSupercmpScheme format_05;
  ktxSupercmpScheme extraout_EDX_08;
  ktxSupercmpScheme extraout_EDX_09;
  ktxSupercmpScheme extraout_EDX_10;
  ktxSupercmpScheme extraout_EDX_11;
  ktxSupercmpScheme extraout_EDX_12;
  ktxSupercmpScheme extraout_EDX_13;
  ktxSupercmpScheme extraout_EDX_14;
  ktxSupercmpScheme extraout_EDX_15;
  ktxSupercmpScheme format_06;
  ktxSupercmpScheme extraout_EDX_16;
  ktxSupercmpScheme extraout_EDX_17;
  ktxSupercmpScheme kVar12;
  ktxSupercmpScheme extraout_EDX_18;
  ktxSupercmpScheme extraout_EDX_19;
  ktxSupercmpScheme extraout_EDX_20;
  ktxSupercmpScheme extraout_EDX_21;
  VkFormat extraout_EDX_22;
  uint32_t fullMipPyramidLevelCount;
  uint max_dim;
  string local_60;
  ktx_uint32_t local_40;
  uint local_3c;
  ktx_uint32_t *local_38;
  
  (*this->_vptr_ValidationContext[2])(this,0,&this->header,0x50,10,"the header");
  format = (this->header).vkFormat;
  local_40 = (this->header).supercompressionScheme;
  if (*(int *)((this->header).identifier + 8) != 0xa1a0a0d ||
      *(long *)(this->header).identifier != -0x44cfcddfa7abb455) {
    fatal<>(this,&FileError::NotKTX2);
  }
  cVar5 = isProhibitedFormat(format);
  if (cVar5 == '\0') {
    bVar6 = isValidFormat(format);
    format_03 = format_01;
    if ((-1 < (int)format & bVar6) == 0) {
      if ((int)format < 0xb9) {
        toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_01);
        error<std::__cxx11::string>(this,&HeaderData::InvalidFormat,&local_60);
        format_03 = extraout_EDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
            &local_60.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                   (ktx_uint32_t)local_60._M_dataplus._M_p),
                          local_60.field_2._M_allocated_capacity + 1);
          format_03 = extraout_EDX_02;
        }
      }
      if (format + ~VK_FORMAT_ASTC_12x12_SRGB_BLOCK < 0x3b9acd2f) {
        toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_03);
        error<std::__cxx11::string>(this,&HeaderData::InvalidFormat,&local_60);
        format_03 = extraout_EDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
            &local_60.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                   (ktx_uint32_t)local_60._M_dataplus._M_p),
                          local_60.field_2._M_allocated_capacity + 1);
          format_03 = extraout_EDX_04;
        }
      }
      if (0x3b9acde7 < (int)format) {
        __s = (char *)vkFormatString(format);
        sVar9 = strlen(__s);
        format_03 = extraout_EDX_05;
        if ((sVar9 == 0x11) &&
           (iVar8 = bcmp(__s,"VK_UNKNOWN_FORMAT",0x11), format_03 = format_02, iVar8 == 0)) {
          toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_02);
          warning<std::__cxx11::string>(this,&HeaderData::UnknownFormat,&local_60);
          format_03 = extraout_EDX_22;
          goto LAB_001a996b;
        }
      }
    }
  }
  else {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_00);
    error<std::__cxx11::string>(this,&HeaderData::ProhibitedFormat,&local_60);
    format_03 = extraout_EDX;
LAB_001a996b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
      format_03 = extraout_EDX_00;
    }
  }
  if (((this->header).supercompressionScheme == 1) && ((this->header).vkFormat != 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_03);
    error<std::__cxx11::string>(this,&HeaderData::VkFormatAndBasis,&local_60);
    format_03 = extraout_EDX_06;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
      format_03 = extraout_EDX_07;
    }
  }
  if ((this->header).vkFormat == 0) {
    if ((this->header).typeSize != 1) {
      toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_03);
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::TypeSizeNotOne,&(this->header).typeSize,&local_60);
      goto LAB_001a9b2d;
    }
  }
  else {
    bVar7 = isFormatBlockCompressed(format);
    if ((bVar7) && ((this->header).typeSize != 1)) {
      toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_04);
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::TypeSizeNotOne,&(this->header).typeSize,&local_60);
LAB_001a9b2d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((this->header).pixelWidth == 0) {
    error<>(this,&HeaderData::WidthZero);
  }
  bVar7 = isFormatBlockCompressed(format);
  kVar12 = format_05;
  if ((bVar7) && ((this->header).pixelHeight == 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_05);
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoHeight,&local_60);
    kVar12 = extraout_EDX_08;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
      kVar12 = extraout_EDX_09;
    }
  }
  args_1 = &(this->header).pixelHeight;
  if ((local_40 == 1) && (*args_1 == 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)0x1,kVar12);
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoHeight,&local_60);
    kVar12 = extraout_EDX_10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
      kVar12 = extraout_EDX_11;
    }
  }
  pkVar1 = &(this->header).pixelWidth;
  if (((this->header).faceCount == 6) && (*pkVar1 != *args_1)) {
    error<unsigned_int&,unsigned_int&>(this,&HeaderData::CubeHeightWidthMismatch,pkVar1,args_1);
    kVar12 = extraout_EDX_12;
  }
  pkVar2 = &(this->header).pixelDepth;
  local_38 = pkVar1;
  if (((this->header).pixelDepth != 0) && ((this->header).pixelHeight == 0)) {
    error<unsigned_int&>(this,&HeaderData::DepthNoHeight,pkVar2);
    kVar12 = extraout_EDX_13;
  }
  if ((format + 0xc460d100 < 0x1e) && (*pkVar2 == 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,kVar12);
    error<std::__cxx11::string>(this,&HeaderData::DepthBlockCompressedNoDepth,&local_60);
    kVar12 = extraout_EDX_14;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
      kVar12 = extraout_EDX_15;
    }
  }
  if ((((format - VK_FORMAT_D16_UNORM < 7) && (format - VK_FORMAT_D16_UNORM != 3)) ||
      (0xfffffffb < format - VK_FORMAT_BC1_RGB_UNORM_BLOCK)) && (*pkVar2 != 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,kVar12);
    error<unsigned_int&,std::__cxx11::string>
              (this,&HeaderData::DepthStencilFormatWithDepth,pkVar2,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
    }
  }
  pkVar1 = &(this->header).faceCount;
  if ((*pkVar1 == 6) && (*pkVar2 != 0)) {
    error<unsigned_int&>(this,&HeaderData::CubeWithDepth,pkVar2);
  }
  if (*pkVar2 == 0) {
    if ((this->header).pixelHeight == 0) {
      this->dimensionCount = 1;
    }
    else {
      this->dimensionCount = 2;
    }
  }
  else {
    this->dimensionCount = 3;
    if ((this->header).layerCount != 0) {
      warning<>(this,&HeaderData::ThreeDArray);
    }
  }
  kVar3 = (this->header).layerCount;
  kVar4 = (this->header).faceCount;
  this->numLayers = kVar3 + (kVar3 == 0);
  if ((kVar4 != 1) && (kVar4 != 6)) {
    error<unsigned_int&>(this,&HeaderData::InvalidFaceCount,pkVar1);
  }
  bVar7 = isFormatBlockCompressed(format);
  kVar12 = format_06;
  if ((bVar7) && ((this->header).levelCount == 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)format,format_06);
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoLevel,&local_60);
    kVar12 = extraout_EDX_16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
      kVar12 = extraout_EDX_17;
    }
  }
  args = &(this->header).levelCount;
  if ((local_40 == 1) && (*args == 0)) {
    toString_abi_cxx11_(&local_60,(ktx *)0x1,kVar12);
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoLevel,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
    }
  }
  kVar3 = (this->header).levelCount;
  uVar10 = kVar3 + (kVar3 == 0);
  this->numLevels = uVar10;
  uVar11 = (this->header).pixelWidth;
  local_3c = (this->header).pixelHeight;
  if (local_3c < uVar11) {
    local_3c = uVar11;
  }
  uVar11 = (this->header).pixelDepth;
  if (local_3c <= uVar11) {
    local_3c = uVar11;
  }
  kVar12 = local_3c >> ((char)uVar10 - 1U & 0x1f);
  if (kVar12 == KTX_SS_BEGIN_RANGE) {
    error<unsigned_int&,unsigned_int_const&>
              (this,&HeaderData::TooManyMipLevels,&this->numLevels,&local_3c);
    kVar12 = extraout_EDX_18;
  }
  uVar11 = (this->header).supercompressionScheme;
  if ((uVar11 & 0xffff0000) == 0x10000) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)local_40,kVar12);
    warning<std::__cxx11::string>(this,&HeaderData::VendorSupercompression,&local_60);
    kVar12 = extraout_EDX_19;
  }
  else {
    if (uVar11 < 4) goto LAB_001a9f01;
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)local_40,kVar12);
    error<std::__cxx11::string>(this,&HeaderData::InvalidSupercompression,&local_60);
    kVar12 = extraout_EDX_20;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p
                            ),local_60.field_2._M_allocated_capacity + 1);
    kVar12 = extraout_EDX_21;
  }
LAB_001a9f01:
  if (this->checkGLTFBasisU == true) {
    if (2 < (this->header).supercompressionScheme) {
      toString_abi_cxx11_(&local_60,(ktx *)(ulong)local_40,kVar12);
      error<std::__cxx11::string>(this,&HeaderData::InvalidSupercompressionGLTFBU,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
    }
    args_1_00 = &(this->header).layerCount;
    if (*pkVar2 != 0) {
      local_60._M_dataplus._M_p._0_4_ = 0;
      error<char_const(&)[11],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [11])0x1fe047,pkVar2,
                 (int *)&local_60);
    }
    if (*args_1_00 != 0) {
      local_60._M_dataplus._M_p._0_4_ = 0;
      error<char_const(&)[11],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [11])0x1fe05a,args_1_00,
                 (int *)&local_60);
    }
    pkVar2 = local_38;
    if (*pkVar1 != 1) {
      local_60._M_dataplus._M_p._0_4_ = 1;
      error<char_const(&)[10],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [10])0x1fe06d,pkVar1,
                 (int *)&local_60);
    }
    if ((*pkVar2 & 3) != 0) {
      error<char_const(&)[11],unsigned_int&>
                (this,&HeaderData::InvalidPixelWidthHeightGLTFBU,(char (*) [11])0x1fe020,pkVar2);
    }
    if ((*args_1 & 3) != 0) {
      error<char_const(&)[12],unsigned_int&>
                (this,&HeaderData::InvalidPixelWidthHeightGLTFBU,(char (*) [12])0x1fe033,args_1);
    }
    uVar11 = local_3c >> 1 | local_3c;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    uVar11 = uVar11 >> 0x10 | uVar11;
    uVar11 = ~(uVar11 >> 1) & uVar11;
    local_60._M_dataplus._M_p._0_4_ =
         ((uint)(0xffff < uVar11) << 4 | (uint)((uVar11 & 0xaaaaaaaa) != 0)) +
         (uint)((uVar11 & 0xcccccccc) != 0) * 2 + (uint)((uVar11 & 0xf0f0f0f0) != 0) * 4 +
         (uint)((uVar11 & 0xff00ff00) != 0) * 8 + 1;
    if ((*args != 1) && (*args != (ktx_uint32_t)local_60._M_dataplus._M_p)) {
      error<unsigned_int&,unsigned_int&>
                (this,&HeaderData::InvalidLevelCountGLTFBU,args,(uint *)&local_60);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateHeader() {
    static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;

    read(0, &header, sizeof(KTX_header2), "the header");
    const auto vkFormat = VkFormat(header.vkFormat);
    const auto supercompressionScheme = ktxSupercmpScheme(header.supercompressionScheme);

    // Validate file identifier
    if (std::memcmp(&header.identifier, ktx2_identifier_reference, 12) != 0)
        fatal(FileError::NotKTX2);

    // Validate vkFormat
    if (isProhibitedFormat(vkFormat)) {
        error(HeaderData::ProhibitedFormat, toString(vkFormat));

    } else if (!isFormatValid(vkFormat)) {
        if (vkFormat <= VK_FORMAT_MAX_STANDARD_ENUM)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (VK_FORMAT_MAX_STANDARD_ENUM < vkFormat && vkFormat < 1000001000)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (1000001000 <= vkFormat && !isFormatKnown(vkFormat))
            warning(HeaderData::UnknownFormat, toString(vkFormat));
    }

    if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (header.vkFormat != VK_FORMAT_UNDEFINED)
            error(HeaderData::VkFormatAndBasis, toString(vkFormat));
    }

    // Validate typeSize
    if (header.vkFormat == VK_FORMAT_UNDEFINED) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));

    } else if (isFormatBlockCompressed(vkFormat)) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));
    }
    // Additional checks are performed on typeSize after the DFD is parsed

    // Validate image dimensions
    if (header.pixelWidth == 0)
        error(HeaderData::WidthZero);

    if (isFormatBlockCompressed(vkFormat))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate pixelHeight

    if (header.faceCount == 6)
        if (header.pixelWidth != header.pixelHeight)
            error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0 && header.pixelHeight == 0)
        error(HeaderData::DepthNoHeight, header.pixelDepth);

    if (isFormat3DBlockCompressed(vkFormat))
        if (header.pixelDepth == 0)
            error(HeaderData::DepthBlockCompressedNoDepth, toString(vkFormat));

    if (isFormatDepth(vkFormat) || isFormatStencil(vkFormat))
        if (header.pixelDepth != 0)
            error(HeaderData::DepthStencilFormatWithDepth, header.pixelDepth, toString(vkFormat));

    if (header.faceCount == 6)
        if (header.pixelDepth != 0)
            error(HeaderData::CubeWithDepth, header.pixelDepth);

    // Detect dimension counts
    if (header.pixelDepth != 0) {
        dimensionCount = 3;
        if (header.layerCount != 0)
            warning(HeaderData::ThreeDArray); // Warning on 3D Array textures
    } else if (header.pixelHeight != 0) {
        dimensionCount = 2;
    } else {
        dimensionCount = 1;
    }

    // Validate layerCount to actual number of layers.
    numLayers = std::max(header.layerCount, 1u);

    // Validate faceCount
    if (header.faceCount != 6 && header.faceCount != 1)
        error(HeaderData::InvalidFaceCount, header.faceCount);

    // 2D Cube map faces were validated by CubeHeightWidthMismatch and CubeWithDepth

    // Validate levelCount
    if (isFormatBlockCompressed(vkFormat))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate levelCount

    numLevels = std::max(header.levelCount, 1u);

    // This test works for arrays too because height or depth will be 0.
    const auto max_dim = std::max(std::max(header.pixelWidth, header.pixelHeight), header.pixelDepth);
    if (max_dim < (1u << (numLevels - 1u))) {
        // Can't have more mip levels than 1 + log2(max(width, height, depth))
        error(HeaderData::TooManyMipLevels, numLevels, max_dim);
    }

    // Validate supercompressionScheme
    if (KTX_SS_BEGIN_VENDOR_RANGE <= header.supercompressionScheme && header.supercompressionScheme <= KTX_SS_END_VENDOR_RANGE)
        warning(HeaderData::VendorSupercompression, toString(supercompressionScheme));
    else if (header.supercompressionScheme < KTX_SS_BEGIN_RANGE || KTX_SS_END_RANGE < header.supercompressionScheme)
        error(HeaderData::InvalidSupercompression, toString(supercompressionScheme));

    // Validate GLTF KHR_texture_basisu compatibility, if needed
    if (checkGLTFBasisU) {
        // Check for allowed supercompression schemes
        switch (header.supercompressionScheme) {
        case KTX_SS_NONE: [[fallthrough]];
        case KTX_SS_BASIS_LZ: [[fallthrough]];
        case KTX_SS_ZSTD:
            break;
        default:
            error(HeaderData::InvalidSupercompressionGLTFBU, toString(supercompressionScheme));
            break;
        }

        // Check that texture type is 2D
        // NOTE: pixelHeight == 0 already covered by other error codes
        if (header.pixelDepth != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "pixelDepth", header.pixelDepth, 0);
        if (header.layerCount != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "layerCount", header.layerCount, 0);
        if (header.faceCount != 1)
            error(HeaderData::InvalidTextureTypeGLTFBU, "faceCount", header.faceCount, 1);

        // Check that width and height are multiples of 4
        if (header.pixelWidth % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelWidth", header.pixelWidth);
        if (header.pixelHeight % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelHeight", header.pixelHeight);

        // Check that levelCount is 1 or that the full mip pyramid is present
        uint32_t fullMipPyramidLevelCount = 1 + (uint32_t)log2(max_dim);
        if (header.levelCount != 1 && header.levelCount != fullMipPyramidLevelCount)
            error(HeaderData::InvalidLevelCountGLTFBU, header.levelCount, fullMipPyramidLevelCount);
    }
}